

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.cpp
# Opt level: O2

void __thiscall
QKeyEvent::QKeyEvent
          (QKeyEvent *this,Type type,int key,KeyboardModifiers modifiers,QString *text,bool autorep,
          quint16 count)

{
  QInputDevice *dev;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  dev = QInputDevice::primaryKeyboard((QString *)&local_58);
  QInputEvent::QInputEvent(&this->super_QInputEvent,type,dev,modifiers);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  *(undefined ***)&this->super_QInputEvent = &PTR__QKeyEvent_0077c9f8;
  QArrayDataPointer<char16_t>::QArrayDataPointer(&(this->m_text).d,&text->d);
  this->m_key = key;
  this->m_scanCode = 0;
  this->m_virtualKey = 0;
  this->m_nativeModifiers = 0;
  *(ushort *)&this->field_0x50 = (ushort)autorep << 0xf | count & 0x7fff;
  if (type == ShortcutOverride) {
    (this->super_QInputEvent).field_0xc = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QKeyEvent::QKeyEvent(Type type, int key, Qt::KeyboardModifiers modifiers, const QString& text,
                     bool autorep, quint16 count)
    : QInputEvent(type, QInputDevice::primaryKeyboard(), modifiers), m_text(text), m_key(key),
      m_scanCode(0), m_virtualKey(0), m_nativeModifiers(0),
      m_count(count), m_autoRepeat(autorep)
{
     if (type == QEvent::ShortcutOverride)
        ignore();
}